

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O2

void Extra_PrintHexadecimal(FILE *pFile,uint *Sign,int nVars)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar1 = (long)(1 << ((byte)nVars & 0x1f)) / 4;
  uVar4 = uVar1 & 0xffffffff;
  iVar2 = (int)uVar1 * 4;
  while( true ) {
    iVar2 = iVar2 + -4;
    if ((int)uVar4 < 1) break;
    uVar3 = (int)uVar4 - 1;
    uVar4 = (ulong)uVar3;
    uVar3 = Sign[uVar3 >> 3] >> ((byte)iVar2 & 0x1c) & 0xf;
    if (uVar3 < 10) {
      fprintf((FILE *)pFile,"%d");
    }
    else {
      fputc(uVar3 + 0x57,(FILE *)pFile);
    }
  }
  return;
}

Assistant:

void Extra_PrintHexadecimal( FILE * pFile, unsigned Sign[], int nVars )
{
    int nDigits, Digit, k;
    // write the number into the file
    nDigits = (1 << nVars) / 4;
    for ( k = nDigits - 1; k >= 0; k-- )
    {
        Digit = ((Sign[k/8] >> ((k%8) * 4)) & 15);
        if ( Digit < 10 )
            fprintf( pFile, "%d", Digit );
        else
            fprintf( pFile, "%c", 'a' + Digit-10 );
    }
//    fprintf( pFile, "\n" );
}